

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false,_false,_false>_>_>
::_build_from_H(Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false,_false,_false>_>_>
                *this,ID_index cellID,Tmp_column *column,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *chainsInH)

{
  uint *puVar1;
  uint *puVar2;
  ID_index cellID_local;
  
  cellID_local = cellID;
  std::
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  ::_M_insert_unique<unsigned_int_const&>
            ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              *)column,&cellID_local);
  puVar1 = (chainsInH->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar2 = (chainsInH->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                .super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    _add_to(this,(this->matrix_).
                 super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false,_false,_false>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + *puVar2,column,1);
  }
  return;
}

Assistant:

inline void Chain_matrix<Master_matrix>::_build_from_H(ID_index cellID,
                                                       Tmp_column& column,
                                                       std::vector<Entry_representative>& chainsInH)
{
  if constexpr (Master_matrix::Option_list::is_z2) {
    column.insert(cellID);
    for (Index idx_h : chainsInH) {
      _add_to(get_column(idx_h), column, 1u);
    }
  } else {
    column.emplace(cellID, 1);
    for (std::pair<Index, Field_element>& idx_h : chainsInH) {
      _add_to(get_column(idx_h.first), column, idx_h.second);
    }
  }
}